

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O3

void __thiscall BRTS_XZ<RemSP>::PerformLabeling(BRTS_XZ<RemSP> *this)

{
  ushort uVar1;
  uint height;
  uint uVar2;
  uint uVar3;
  Mat1b *pMVar4;
  int *piVar5;
  Mat1i *pMVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  Run *pRVar10;
  int iVar11;
  uint uVar12;
  uint64_t *puVar13;
  Run *pRVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar25;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  long local_c0;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  height = *(uint *)&pMVar4->field_0x8;
  uVar2 = *(uint *)&pMVar4->field_0xc;
  (this->data_compressed).height = height;
  (this->data_compressed).width = uVar2;
  uVar12 = uVar2 + 0x3f;
  if (-1 < (int)uVar2) {
    uVar12 = uVar2;
  }
  iVar11 = ((int)uVar12 >> 6) + 1;
  (this->data_compressed).data_width = iVar11;
  uVar12 = iVar11 * height;
  uVar15 = 0xffffffffffffffff;
  if (-1 < (int)uVar12) {
    uVar15 = (ulong)uVar12 * 8;
  }
  puVar13 = (uint64_t *)operator_new__(uVar15);
  (this->data_compressed).bits = puVar13;
  InitCompressedData(this,&this->data_compressed);
  (this->data_runs).height = height;
  (this->data_runs).width = uVar2;
  pRVar14 = (Run *)operator_new__((ulong)(((uVar2 >> 1) + 2) * height + 1) << 3);
  (this->data_runs).runs = pRVar14;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar11 = *(int *)&pMVar4->field_0x8;
  iVar25 = *(int *)&pMVar4->field_0xc;
  RemSP::P_ = (uint *)operator_new__((ulong)(((iVar25 - (iVar25 + 1 >> 0x1f)) + 1 >> 1) *
                                             ((iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1) + 1) << 2);
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  FindRuns(this,(this->data_compressed).bits,height,(this->data_compressed).data_width,pRVar14);
  pRVar14 = (this->data_runs).runs;
  piVar5 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_90,*piVar5,piVar5[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  if (0 < (int)height) {
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar7 = *(long *)&pMVar6->field_0x10;
    lVar8 = **(long **)&pMVar6->field_0x48;
    local_c0 = lVar7 + 8;
    uVar15 = 0;
    auVar26 = _DAT_00328420;
    auVar27 = _DAT_00328430;
    auVar28 = _DAT_00328440;
    do {
      puVar9 = RemSP::P_;
      lVar20 = lVar8 * uVar15 + lVar7;
      uVar12 = 0;
      pRVar10 = pRVar14;
      do {
        pRVar14 = pRVar10;
        if (pRVar14->start_pos == 0xffff) {
          if ((int)uVar12 < (int)uVar2) {
            memset((void *)((long)(int)uVar12 * 4 + lVar20),0,(ulong)(~uVar12 + uVar2) * 4 + 4);
            auVar26 = _DAT_00328420;
            auVar27 = _DAT_00328430;
            auVar28 = _DAT_00328440;
          }
          pRVar14 = pRVar14 + 1;
          break;
        }
        uVar1 = pRVar14->end_pos;
        uVar3 = puVar9[pRVar14->label];
        uVar21 = (uint)pRVar14->start_pos;
        if (uVar12 < uVar21) {
          memset((void *)((long)(int)uVar12 * 4 + lVar20),0,(ulong)(~uVar12 + uVar21) * 4 + 4);
          auVar26 = _DAT_00328420;
          auVar27 = _DAT_00328430;
          auVar28 = _DAT_00328440;
          uVar12 = uVar21;
        }
        if (uVar12 < uVar1) {
          lVar16 = (long)(int)uVar12;
          uVar12 = (uint)uVar1;
          lVar17 = (ulong)uVar1 - lVar16;
          lVar18 = lVar17 + -1;
          auVar22._8_4_ = (int)lVar18;
          auVar22._0_8_ = lVar18;
          auVar22._12_4_ = (int)((ulong)lVar18 >> 0x20);
          lVar16 = local_c0 + lVar16 * 4;
          auVar22 = auVar22 ^ auVar28;
          uVar19 = 0;
          do {
            auVar23._8_4_ = (int)uVar19;
            auVar23._0_8_ = uVar19;
            auVar23._12_4_ = (int)(uVar19 >> 0x20);
            auVar24 = (auVar23 | auVar27) ^ auVar28;
            iVar11 = auVar22._4_4_;
            if ((bool)(~(iVar11 < auVar24._4_4_ ||
                        auVar22._0_4_ < auVar24._0_4_ && auVar24._4_4_ == iVar11) & 1)) {
              *(uint *)(lVar16 + -8 + uVar19 * 4) = uVar3;
            }
            if (auVar24._12_4_ <= auVar22._12_4_ &&
                (auVar24._8_4_ <= auVar22._8_4_ || auVar24._12_4_ != auVar22._12_4_)) {
              *(uint *)(lVar16 + -4 + uVar19 * 4) = uVar3;
            }
            auVar23 = (auVar23 | auVar26) ^ auVar28;
            iVar25 = auVar23._4_4_;
            if (iVar25 <= iVar11 && (iVar25 != iVar11 || auVar23._0_4_ <= auVar22._0_4_)) {
              *(uint *)(lVar16 + uVar19 * 4) = uVar3;
              *(uint *)(lVar16 + 4 + uVar19 * 4) = uVar3;
            }
            uVar19 = uVar19 + 4;
          } while ((lVar17 + 3U & 0xfffffffffffffffc) != uVar19);
        }
        pRVar10 = pRVar14 + 1;
      } while (uVar21 != 0xffff);
      uVar15 = uVar15 + 1;
      local_c0 = local_c0 + lVar8;
    } while (uVar15 != height);
  }
  if (RemSP::P_ != (uint *)0x0) {
    operator_delete__(RemSP::P_);
  }
  pRVar14 = (this->data_runs).runs;
  if (pRVar14 != (Run *)0x0) {
    operator_delete__(pRVar14);
  }
  puVar13 = (this->data_compressed).bits;
  if (puVar13 != (uint64_t *)0x0) {
    operator_delete__(puVar13);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        img_labels_ = cv::Mat1i(img_.size());
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) labels[j] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (; j < end_pos; j++) labels[j] = label;
            }
        }

        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }